

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.cpp
# Opt level: O0

DNA * __thiscall Population::GetDNAWithProbability(Population *this,double probability)

{
  bool bVar1;
  reference pDVar2;
  DNA *dna;
  const_iterator __end1;
  const_iterator __begin1;
  vector<DNA,_std::allocator<DNA>_> *__range1;
  double sum;
  double probability_local;
  Population *this_local;
  
  __range1 = (vector<DNA,_std::allocator<DNA>_> *)0x0;
  __end1 = std::vector<DNA,_std::allocator<DNA>_>::begin(&this->population_);
  dna = (DNA *)std::vector<DNA,_std::allocator<DNA>_>::end(&this->population_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_DNA_*,_std::vector<DNA,_std::allocator<DNA>_>_>
                                *)&dna);
    if (!bVar1) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/vocheretnyi[P]genetic-schedule/Population.cpp"
                    ,0x9c,"const DNA &Population::GetDNAWithProbability(double) const");
    }
    pDVar2 = __gnu_cxx::__normal_iterator<const_DNA_*,_std::vector<DNA,_std::allocator<DNA>_>_>::
             operator*(&__end1);
    __range1 = (vector<DNA,_std::allocator<DNA>_> *)(pDVar2->fitness + (double)__range1);
    if (probability < (double)__range1) break;
    __gnu_cxx::__normal_iterator<const_DNA_*,_std::vector<DNA,_std::allocator<DNA>_>_>::operator++
              (&__end1);
  }
  return pDVar2;
}

Assistant:

const DNA& Population::GetDNAWithProbability(double probability) const {
    double sum = 0.0f;
    for (const DNA& dna : population_) {
        sum += dna.fitness;
        if (probability < sum) {
            return dna;
        }
    }
    assert(false);
    return DNA();
}